

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetBufferf(void)

{
  uint32 name_00;
  ALenum param_00;
  ALfloat *origvalue_00;
  float value_00;
  ALfloat value;
  ALfloat *origvalue;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    origvalue_00 = (ALfloat *)IO_PTR();
    value_00 = IO_FLOAT();
    if (io_failure == 0) {
      visit_alGetBufferf((CallerInfo *)&param,name_00,param_00,origvalue_00,value_00);
    }
  }
  return;
}

Assistant:

static void decode_alGetBufferf(void)
{
    IO_START(alGetBufferf);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    ALfloat *origvalue = (ALfloat *) IO_PTR();
    const ALfloat value = IO_FLOAT();
    if (!io_failure) visit_alGetBufferf(&callerinfo, name, param, origvalue, value);
    IO_END();
}